

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O1

int runtest(int i)

{
  int iVar1;
  int iVar2;
  FILE *__stream;
  int iVar3;
  int iVar4;
  int extraout_EAX;
  int iVar5;
  char *pcVar6;
  char *__file;
  char *pcVar7;
  ulong uVar8;
  char *__format;
  long lVar9;
  stat buf;
  glob64_t local_108;
  stat64 local_c0;
  
  iVar2 = nb_tests;
  iVar1 = nb_leaks;
  iVar5 = nb_errors;
  if ((tests_quiet == '\0') && (testDescriptions[i].desc != (char *)0x0)) {
    printf("## %s\n");
  }
  if (testDescriptions[i].in == (char *)0x0) {
    iVar3 = (*testDescriptions[i].func)
                      ((char *)0x0,(char *)0x0,(char *)0x0,testDescriptions[i].options);
    if (iVar3 != 0) {
      nb_errors = nb_errors + 1;
    }
  }
  else {
    local_108.gl_offs = 0;
    glob64(testDescriptions[i].in,8,(__errfunc *)0x0,&local_108);
    if (local_108.gl_pathc != 0) {
      uVar8 = 0;
      do {
        iVar3 = stat64(local_108.gl_pathv[uVar8],&local_c0);
        if ((iVar3 != -1) && ((local_c0.st_mode & 0xf000) == 0x8000)) {
          if (testDescriptions[i].suffix == (char *)0x0) {
            pcVar6 = (char *)0x0;
          }
          else {
            pcVar7 = local_108.gl_pathv[uVar8];
            pcVar6 = resultFilename(pcVar7,testDescriptions[i].out,testDescriptions[i].suffix);
            if (pcVar6 == (char *)0x0) {
              runtest_cold_1();
              goto LAB_0010288a;
            }
          }
          if (testDescriptions[i].err == (char *)0x0) {
            __file = (char *)0x0;
          }
          else {
            pcVar7 = local_108.gl_pathv[uVar8];
            __file = resultFilename(pcVar7,testDescriptions[i].out,testDescriptions[i].err);
            if (__file == (char *)0x0) {
LAB_0010288a:
              runtest_cold_2();
              if (pcVar7 == (char *)0x0) {
                return 0;
              }
              pcVar6 = "test/recurse/huge.xml";
              lVar9 = 0;
              do {
                iVar5 = strcmp(pcVar7,pcVar6);
                if (iVar5 == 0) {
                  return 1;
                }
                pcVar6 = *(char **)((long)&hugeDocTable[1].URL + lVar9);
                lVar9 = lVar9 + 0x20;
              } while (lVar9 != 0x40);
              return 0;
            }
          }
          if ((pcVar6 == (char *)0x0) ||
             ((iVar3 = stat64(pcVar6,&local_c0), iVar3 != -1 &&
              ((local_c0.st_mode & 0xf000) == 0x8000)))) {
            if ((__file != (char *)0x0) &&
               ((iVar3 = stat64(__file,&local_c0), iVar3 == -1 ||
                ((local_c0.st_mode & 0xf000) != 0x8000)))) {
              __format = "Missing error file %s\n";
              pcVar7 = __file;
              goto LAB_001027e8;
            }
            iVar3 = xmlMemUsed();
            iVar4 = (*testDescriptions[i].func)
                              (local_108.gl_pathv[uVar8],pcVar6,__file,
                               testDescriptions[i].options | 0x10000);
            xmlResetLastError();
            if (iVar4 == 0) {
              iVar4 = xmlMemUsed();
              __stream = _stderr;
              if (iVar4 != iVar3) {
                pcVar7 = local_108.gl_pathv[uVar8];
                iVar4 = xmlMemUsed();
                fprintf(__stream,"File %s leaked %d bytes\n",pcVar7,(ulong)(uint)(iVar4 - iVar3));
                nb_leaks = nb_leaks + 1;
              }
            }
            else {
              fprintf(_stderr,"File %s generated an error\n",local_108.gl_pathv[uVar8]);
              nb_errors = nb_errors + 1;
            }
          }
          else {
            __format = "Missing result file %s\n";
            pcVar7 = pcVar6;
LAB_001027e8:
            fprintf(_stderr,__format,pcVar7);
          }
          if (pcVar6 != (char *)0x0) {
            free(pcVar6);
          }
          if (__file != (char *)0x0) {
            free(__file);
          }
        }
        uVar8 = uVar8 + 1;
      } while (uVar8 < local_108.gl_pathc);
    }
    globfree64(&local_108);
    iVar3 = extraout_EAX;
  }
  if (verbose == '\x01') {
    if (nb_leaks == iVar1 && nb_errors == iVar5) {
      iVar3 = printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar2));
    }
    else {
      iVar3 = printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar2),
                     (ulong)(uint)(nb_errors - iVar5),(ulong)(uint)(nb_leaks - iVar1));
    }
  }
  return iVar3;
}

Assistant:

static int
runtest(int i) {
    int ret = 0, res;
    int old_errors, old_tests, old_leaks;

    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    if ((tests_quiet == 0) && (testDescriptions[i].desc != NULL))
	printf("## %s\n", testDescriptions[i].desc);
    res = launchTests(&testDescriptions[i]);
    if (res != 0)
	ret++;
    if (verbose) {
	if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	    printf("Ran %d tests, no errors\n", nb_tests - old_tests);
	else
	    printf("Ran %d tests, %d errors, %d leaks\n",
		   nb_tests - old_tests,
		   nb_errors - old_errors,
		   nb_leaks - old_leaks);
    }
    return(ret);
}